

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

int Fra_ImpCheckForNode(Fra_Man_t *p,Vec_Int_t *vImps,Aig_Obj_t *pNode,int Pos)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  Aig_Obj_t *pNew;
  ulong uVar9;
  void *pvVar10;
  Aig_Obj_t *pOld;
  uint uVar11;
  uint uVar12;
  
  if (Pos < vImps->nSize) {
    uVar9 = (ulong)(uint)Pos;
    do {
      if (Pos < 0) goto LAB_006948ae;
      piVar1 = vImps->pArray;
      uVar8 = piVar1[uVar9];
      if (uVar8 != 0) {
        uVar7 = (int)uVar8 >> 0x10;
        uVar11 = uVar7;
        if ((int)uVar7 < (int)(uVar8 & 0xffff)) {
          uVar11 = uVar8 & 0xffff;
        }
        if ((int)uVar11 < pNode->Id) {
          __assert_fail("Max >= pNode->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                        ,0x204,"int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)"
                       );
        }
        if (pNode->Id < (int)uVar11) break;
        pVVar2 = p->pManAig->vObjs;
        if (pVVar2 == (Vec_Ptr_t *)0x0) {
          pvVar10 = (void *)0x0;
        }
        else {
          if (pVVar2->nSize <= (int)(uVar8 & 0xffff)) goto LAB_0069488f;
          pvVar10 = pVVar2->pArray[(ushort)uVar8];
        }
        if (((int)uVar7 < 0) || (pVVar2->nSize <= (int)uVar7)) {
LAB_0069488f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = pVVar2->pArray[uVar7];
        iVar6 = p->pPars->nFramesK;
        uVar4 = *(ulong *)(*(long *)(*(long *)((long)pvVar10 + 0x28) + 0x20) +
                          (long)(*(int *)((long)pvVar10 + 0x24) *
                                 *(int *)(*(long *)((long)pvVar10 + 0x28) + 0x18) + iVar6) * 8);
        uVar5 = *(ulong *)(*(long *)(*(long *)((long)pvVar3 + 0x28) + 0x20) +
                          (long)(*(int *)((long)pvVar3 + 0x24) *
                                 *(int *)(*(long *)((long)pvVar3 + 0x28) + 0x18) + iVar6) * 8);
        uVar11 = *(uint *)((long)pvVar10 + 0x18) >> 3 & 1;
        uVar12 = (uint)uVar4 & 1;
        uVar8 = uVar11 ^ uVar12;
        uVar7 = ((uint)uVar5 ^ *(uint *)((long)pvVar3 + 0x18) >> 3) & 1;
        pOld = (Aig_Obj_t *)(uVar4 & 0xfffffffffffffffe);
        pNew = (Aig_Obj_t *)(uVar5 & 0xfffffffffffffffe);
        if (pOld == pNew) {
          if ((uVar8 != uVar7) && (((*(uint *)&pOld->field_0x18 & 7) != 1 || (uVar11 == uVar12)))) {
            p->pCla->fRefinement = 1;
            piVar1[uVar9] = 0;
          }
        }
        else {
          iVar6 = Fra_NodesAreImp(p,pOld,pNew,uVar8,uVar7);
          if (iVar6 != 1) {
            p->pCla->fRefinement = 1;
            if (iVar6 == 0) {
              Fra_SmlResimulate(p);
            }
            if (vImps->nSize <= (int)uVar9) {
LAB_006948ae:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vImps->pArray[uVar9] != 0) {
              puts("Fra_ImpCheckForNode(): Implication is not refined!");
            }
            if (vImps->nSize <= (int)uVar9) goto LAB_006948ae;
            if (vImps->pArray[uVar9] != 0) {
              __assert_fail("Vec_IntEntry(vImps, i) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                            ,0x22e,
                            "int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)");
            }
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < vImps->nSize);
    Pos = (int)uVar9;
  }
  return Pos;
}

Assistant:

int Fra_ImpCheckForNode( Fra_Man_t * p, Vec_Int_t * vImps, Aig_Obj_t * pNode, int Pos )
{
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftF, * pRightF;
    int i, Imp, Left, Right, Max, RetValue;
    int fComplL, fComplR;
    Vec_IntForEachEntryStart( vImps, Imp, i, Pos )
    {
        if ( Imp == 0 )
            continue;
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        Max = Abc_MaxInt( Left, Right );
        assert( Max >= pNode->Id );
        if ( Max > pNode->Id )
            return i;
        // get the corresponding nodes
        pLeft  = Aig_ManObj( p->pManAig, Left );
        pRight = Aig_ManObj( p->pManAig, Right );
        // get the corresponding FRAIG nodes
        pLeftF  = Fra_ObjFraig( pLeft, p->pPars->nFramesK );
        pRightF = Fra_ObjFraig( pRight, p->pPars->nFramesK );
        // get the complemented attributes
        fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF);
        fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF);
        // check equality
        if ( Aig_Regular(pLeftF) == Aig_Regular(pRightF) )
        {
            if ( fComplL == fComplR ) // x => x  - always true
                continue;
            assert( fComplL != fComplR );
            // consider 4 possibilities:
            // NOT(1) => 1    or   0 => 1  - always true
            // 1 => NOT(1)    or   1 => 0  - never true
            // NOT(x) => x    or   x       - not always true
            // x => NOT(x)    or   NOT(x)  - not always true
            if ( Aig_ObjIsConst1(Aig_Regular(pLeftF)) && fComplL ) // proved implication
                continue;
            // disproved implication
            p->pCla->fRefinement = 1;
            Vec_IntWriteEntry( vImps, i, 0 );
            continue;
        }
        // check the implication 
        // - if true, a clause is added
        // - if false, a cex is simulated
        // make sure the implication is refined
        RetValue = Fra_NodesAreImp( p, Aig_Regular(pLeftF), Aig_Regular(pRightF), fComplL, fComplR );
        if ( RetValue != 1 )
        {
            p->pCla->fRefinement = 1;
            if ( RetValue == 0 )
                Fra_SmlResimulate( p );
            if ( Vec_IntEntry(vImps, i) != 0 )
                printf( "Fra_ImpCheckForNode(): Implication is not refined!\n" );
            assert( Vec_IntEntry(vImps, i) == 0 );
        }
    }
    return i;
}